

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityPrintExpectedAndActualStrings(char *expected,char *actual)

{
  UnityPrint(" Expected ");
  if (expected == (char *)0x0) {
    UnityPrint("NULL");
  }
  else {
    putchar(0x27);
    UnityPrint(expected);
    putchar(0x27);
  }
  UnityPrint(" Was ");
  if (actual != (char *)0x0) {
    putchar(0x27);
    UnityPrint(actual);
    putchar(0x27);
    return;
  }
  UnityPrint("NULL");
  return;
}

Assistant:

static void UnityPrintExpectedAndActualStrings(const char* expected, const char* actual)
{
    UnityPrint(UnityStrExpected);
    if (expected != NULL)
    {
        UNITY_OUTPUT_CHAR('\'');
        UnityPrint(expected);
        UNITY_OUTPUT_CHAR('\'');
    }
    else
    {
      UnityPrint(UnityStrNull);
    }
    UnityPrint(UnityStrWas);
    if (actual != NULL)
    {
        UNITY_OUTPUT_CHAR('\'');
        UnityPrint(actual);
        UNITY_OUTPUT_CHAR('\'');
    }
    else
    {
      UnityPrint(UnityStrNull);
    }
}